

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

unit_data __thiscall units::detail::unit_data::root(unit_data *this,int power)

{
  bool bVar1;
  int in_ESI;
  unit_data *in_RDI;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint local_80;
  unit_data local_34;
  
  bVar1 = hasValidRoot(in_RDI,in_ESI);
  if (bVar1) {
    if (in_ESI % 2 == 0) {
      local_80 = 0;
    }
    else {
      local_80 = (uint)*in_RDI >> 0x1d & 1;
    }
    unit_data(&local_34,(((int)*in_RDI << 0x1c) >> 0x1c) / in_ESI,
              (((int)*in_RDI << 0x15) >> 0x1d) / in_ESI,(((int)*in_RDI << 0x18) >> 0x1c) / in_ESI,
              (((int)*in_RDI << 0x12) >> 0x1d) / in_ESI,(((int)*in_RDI << 0xd) >> 0x1d) / in_ESI,
              (((int)*in_RDI << 0xb) >> 0x1e) / in_ESI,(((int)*in_RDI << 0x10) >> 0x1e) / in_ESI,
              (((int)*in_RDI << 6) >> 0x1e) / in_ESI,(((int)*in_RDI << 4) >> 0x1e) / in_ESI,
              (((int)*in_RDI << 8) >> 0x1d) / in_ESI,(uint)*in_RDI >> 0x1c & 1,local_80,
              (uint)*in_RDI >> 0x1e & 1,0);
  }
  else {
    unit_data((unit_data *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
              (nullptr_t)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  }
  return local_34;
}

Assistant:

constexpr unit_data root(int power) const
        {
            return (hasValidRoot(power)) ? unit_data(
                                               meter_ / power,
                                               kilogram_ / power,
                                               second_ / power,
                                               ampere_ / power,
                                               kelvin_ / power,
                                               mole_ / power,
                                               candela_ / power,
                                               currency_ / power,
                                               count_ / power,
                                               radians_ / power,
                                               per_unit_,
                                               (power % 2 == 0) ? 0U : i_flag_,
                                               e_flag_,
                                               0) :
                                           unit_data(nullptr);
        }